

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetWritable
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          BOOL value)

{
  byte bVar1;
  ScriptContext *this_00;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  DictionaryPropertyDescriptor<int> *this_01;
  bool bVar4;
  BOOL BVar5;
  PropertyId propertyId_00;
  undefined4 *puVar6;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<int> *descriptor;
  int i;
  BOOL local_34;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x52b,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) goto LAB_00dac79e;
    *puVar6 = 0;
  }
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  local_34 = value;
  local_50 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_50,
                     (DictionaryPropertyDescriptor<int> **)&propertyRecord,(int *)&descriptor);
  if (bVar4) {
    bVar1 = *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + 1);
    BVar5 = 0;
    if ((bVar1 & 8) == 0) {
      if (((bVar1 & 0x10) == 0) ||
         (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 2) != 0)) {
        if (local_34 == 0) {
          *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + 1) = bVar1 & 0xf3;
          pJVar2 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
          Memory::Recycler::WBSetBit((char *)&descriptor);
          descriptor = (DictionaryPropertyDescriptor<int> *)
                       &pJVar2->typesWithOnlyWritablePropertyProtoChain;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
          this_01 = descriptor;
          if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject & 0x400) == 0) {
            DynamicTypeHandler::SetHasOnlyWritableDataProperties
                      (&this->super_DynamicTypeHandler,false);
            if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
              propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(this_00,propertyId);
              ScriptContext::InvalidateStoreFieldCaches(this_00,propertyId_00);
              PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                        ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)this_01);
            }
          }
        }
        else {
          *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + 1) = bVar1 | 4;
        }
        DynamicObject::ChangeType(instance);
        BVar5 = 1;
      }
      else {
        BVar5 = 0;
        if ((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
            TypeIds_GlobalObject) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x537,"(VarIs<RootObjectBase>(instance))",
                                      "object must be a global object if letconstglobal is set");
          if (!bVar4) {
LAB_00dac79e:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
      }
    }
  }
  else {
    bVar4 = DynamicObject::HasObjectArray(instance);
    BVar5 = 0;
    if ((bVar4) && (local_50->isNumeric == true)) {
      BVar5 = DynamicObject::SetObjectArrayItemWritable(instance,propertyId,local_34);
    }
  }
  return BVar5;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (!descriptor->HasNonLetConstGlobal())
            {
                AssertMsg(VarIs<RootObjectBase>(instance), "object must be a global object if letconstglobal is set");
                return false;
            }

            if (value)
            {
                descriptor->Attributes |= PropertyWritable;
            }
            else
            {
                descriptor->Attributes &= (~PropertyWritable);

                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);
            }
            instance->ChangeType();
            return true;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return instance->SetObjectArrayItemWritable(propertyId, value);
        }

        return false;
    }